

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget.cpp
# Opt level: O2

void __thiscall QGraphicsWidget::adjustSize(QGraphicsWidget *this)

{
  long in_FS_OFFSET;
  QSizeF local_38;
  QSizeF local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.wd = -1.0;
  local_38.ht = -1.0;
  local_20 = QGraphicsLayoutItem::effectiveSizeHint
                       ((QGraphicsLayoutItem *)(this + 0x20),PreferredSize,&local_38);
  if ((0.0 <= local_20.wd) && (0.0 <= local_20.ht)) {
    resize(this,&local_20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsWidget::adjustSize()
{
    QSizeF sz = effectiveSizeHint(Qt::PreferredSize);
    // What if sz is not valid?!
    if (sz.isValid())
        resize(sz);
}